

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::anon_unknown_17::MthdSifmPitch::is_valid_val(MthdSifmPitch *this)

{
  MthdSifmPitch *this_local;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
       chipset.card_type < 4) || ((this->super_SingleMthdTest).super_MthdTest.cls == 0x37)) {
    this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xffffe000) == 0;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x38 == 0) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x38 < 3) {
    if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x38 < 2) {
      if ((((((this->super_SingleMthdTest).super_MthdTest.cls == 0x37) ||
            ((this->super_SingleMthdTest).super_MthdTest.cls == 0x77)) ||
           ((this->super_SingleMthdTest).super_MthdTest.cls == 99)) ||
          ((this->super_SingleMthdTest).super_MthdTest.cls == 0x67)) &&
         (((this->super_SingleMthdTest).super_MthdTest.val & 0xe000) != 0)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (chipset.card_type < 4 || cls == 0x37) {
			return !(val & ~0x1fff);
		} else {
			if (!extr(val, 16, 8))
				return false;
			if (extr(val, 16, 8) > 2)
				return false;
			if (extr(val, 24, 8) > 1)
				return false;
			if (cls == 0x37 || cls == 0x77 || cls == 0x63 || cls == 0x67) {
				if (val & 0xe000)
					return false;
			}
			return true;
		}
	}